

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O1

void Qentem::Memory::Copy<unsigned_int>(void *to,void *from,uint size)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  uVar2 = 0;
  if (0xf < size) {
    uVar2 = (ulong)(size & 0xfffffff0);
    puVar3 = (undefined8 *)from;
    puVar4 = (undefined8 *)to;
    do {
      uVar1 = puVar3[1];
      *puVar4 = *puVar3;
      puVar4[1] = uVar1;
      puVar3 = puVar3 + 2;
      puVar4 = puVar4 + 2;
    } while (puVar3 < (undefined8 *)((long)from + uVar2));
  }
  if ((uint)uVar2 < size) {
    do {
      *(undefined1 *)((long)to + uVar2) = *(undefined1 *)((long)from + uVar2);
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
  }
  return;
}

Assistant:

QENTEM_NOINLINE static void Copy(void *to, const void *from, Number_T size) noexcept {
    Number_T offset = 0;

    if (Config::IsSIMDEnabled) {
        const Number_T m_size = (size >> Platform::SIMD::Shift);

        if (m_size != 0) {
            offset = m_size;
            offset <<= Platform::SIMD::Shift;

            Platform::SIMD::VAR_T       *m_to   = (Platform::SIMD::VAR_T *)(to);
            const Platform::SIMD::VAR_T *m_form = (const Platform::SIMD::VAR_T *)(from);
            const Platform::SIMD::VAR_T *end    = (m_form + m_size);

            do {
                Platform::SIMD::Store(m_to, Platform::SIMD::Load(m_form));
                ++m_form;
                ++m_to;
            } while (m_form < end);
        }
    }

    char       *des = (char *)(to);
    const char *src = (const char *)(from);

    while (offset < size) {
        des[offset] = src[offset];
        ++offset;
    }
}